

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

bool __thiscall Am_Object::Is_Instance_Of(Am_Object *this,Am_Object *in_prototype)

{
  Am_Object_Data *pAVar1;
  
  do {
    pAVar1 = this->data;
    if (pAVar1 == (Am_Object_Data *)0x0) break;
    this = (Am_Object *)&pAVar1->prototype;
  } while (pAVar1 != in_prototype->data);
  return pAVar1 != (Am_Object_Data *)0x0;
}

Assistant:

bool
Am_Object::Is_Instance_Of(Am_Object in_prototype) const
{
  Am_Object_Data *current = data;
  while (current) {
    if (current == in_prototype.data)
      return true;
    current = current->prototype;
  }
  return false;
}